

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void copy_objects_internal(Am_Object *cmd,Am_Value *new_sel)

{
  unsigned_short uVar1;
  Am_Wrapper *pAVar2;
  Am_Value_List local_88;
  Am_Object local_78;
  Am_Value local_70;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Value_List selected_objs;
  Am_Object local_28;
  Am_Object group;
  Am_Object selection_widget;
  Am_Value *new_sel_local;
  Am_Object *cmd_local;
  
  Am_Object::Am_Object(&group);
  Am_Object::Am_Object(&local_28);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48);
  Am_Object::Am_Object(&local_58,cmd);
  Am_Get_Selection_Widget_For_Command(&local_50);
  Am_Object::operator=(&group,&local_50);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&local_60,&group);
  Am_Value::Am_Value(&local_70,new_sel);
  Am_Get_Sel_Or_Param_In_Display_Order(&local_60,(Am_Value_List *)local_48,&local_28,&local_70);
  Am_Value::~Am_Value(&local_70);
  Am_Object::~Am_Object(&local_60);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_48);
  Am_Object::Set(cmd,0x16d,pAVar2,0);
  Am_Object::Set(cmd,0x16f,false,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Object::Set(cmd,0x171,pAVar2,0);
  Am_Object::Am_Object(&local_78,cmd);
  Am_Value_List::Am_Value_List(&local_88,(Am_Value_List *)local_48);
  copy_objects_into_clipboard(&local_78,&local_88);
  Am_Value_List::~Am_Value_List(&local_88);
  Am_Object::~Am_Object(&local_78);
  uVar1 = Am_Value_List::Length((Am_Value_List *)local_48);
  Am_Object::Set(cmd,0x169,(uint)uVar1,0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&group);
  return;
}

Assistant:

void
copy_objects_internal(Am_Object &cmd, Am_Value new_sel)
{
  Am_Object selection_widget, group;
  Am_Value_List selected_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  Am_Get_Sel_Or_Param_In_Display_Order(selection_widget, selected_objs, group,
                                       new_sel);
  cmd.Set(Am_OBJECT_MODIFIED, selected_objs);
  cmd.Set(Am_HAS_BEEN_UNDONE, false);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  copy_objects_into_clipboard(cmd, selected_objs);
  cmd.Set(Am_VALUE, selected_objs.Length()); //not used
}